

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int sx_hashtbl_add(sx_hashtbl *tbl,uint32_t key,int value)

{
  code *pcVar1;
  int iVar2;
  uint local_1c;
  uint32_t cnt;
  uint32_t h;
  int value_local;
  uint32_t key_local;
  sx_hashtbl *tbl_local;
  
  if (tbl->capacity <= tbl->count) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/hash.c",
                      0x11b,"tbl->count < tbl->capacity");
    pcVar1 = (code *)swi(3);
    iVar2 = (*pcVar1)();
    return iVar2;
  }
  local_1c = sx__fib_hash(key,tbl->_bitshift);
  for (; tbl->keys[local_1c] != 0; local_1c = (local_1c + 1) % (uint)tbl->capacity) {
  }
  if (tbl->keys[local_1c] != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/hash.c",
                      0x123,"tbl->keys[h] == 0");
    pcVar1 = (code *)swi(3);
    iVar2 = (*pcVar1)();
    return iVar2;
  }
  tbl->keys[local_1c] = key;
  tbl->values[local_1c] = value;
  tbl->count = tbl->count + 1;
  return local_1c;
}

Assistant:

int sx_hashtbl_add(sx_hashtbl* tbl, uint32_t key, int value)
{
    sx_assert(tbl->count < tbl->capacity);

    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    while (tbl->keys[h] != 0) {
        h = (h + 1) % cnt;
    }

    sx_assert(tbl->keys[h] == 0);    // something went wrong!
    tbl->keys[h] = key;
    tbl->values[h] = value;
    ++tbl->count;
    return h;
}